

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddText(ImDrawList *this,ImFont *font,float font_size,ImVec2 *pos,ImU32 col,
                   char *text_begin,char *text_end,float wrap_width,ImVec4 *cpu_fine_clip_rect)

{
  size_t sVar1;
  float fVar2;
  undefined1 local_54 [8];
  ImVec4 clip_rect;
  float wrap_width_local;
  char *text_end_local;
  char *text_begin_local;
  ImU32 col_local;
  ImVec2 *pos_local;
  ImFont *pIStack_18;
  float font_size_local;
  ImFont *font_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    clip_rect.z = wrap_width;
    unique0x100001f8 = text_end;
    if (text_end == (char *)0x0) {
      sVar1 = strlen(text_begin);
      register0x00000000 = text_begin + sVar1;
    }
    if (text_begin != stack0xffffffffffffffc0) {
      pIStack_18 = font;
      if (font == (ImFont *)0x0) {
        pIStack_18 = this->_Data->Font;
      }
      pos_local._4_4_ = font_size;
      if ((font_size == 0.0) && (!NAN(font_size))) {
        pos_local._4_4_ = this->_Data->FontSize;
      }
      if (pIStack_18->ContainerAtlas->TexID != (this->_CmdHeader).TextureId) {
        __assert_fail("font->ContainerAtlas->TexID == _CmdHeader.TextureId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x62a,
                      "void ImDrawList::AddText(const ImFont *, float, const ImVec2 &, ImU32, const char *, const char *, float, const ImVec4 *)"
                     );
      }
      local_54._0_4_ = (this->_CmdHeader).ClipRect.x;
      local_54._4_4_ = (this->_CmdHeader).ClipRect.y;
      clip_rect.x = (this->_CmdHeader).ClipRect.z;
      clip_rect.y = (this->_CmdHeader).ClipRect.w;
      if (cpu_fine_clip_rect != (ImVec4 *)0x0) {
        fVar2 = ImMax<float>((float)local_54._0_4_,cpu_fine_clip_rect->x);
        local_54._0_4_ = fVar2;
        fVar2 = ImMax<float>((float)local_54._4_4_,cpu_fine_clip_rect->y);
        local_54._4_4_ = fVar2;
        fVar2 = ImMin<float>(clip_rect.x,cpu_fine_clip_rect->z);
        clip_rect.x = fVar2;
        fVar2 = ImMin<float>(clip_rect.y,cpu_fine_clip_rect->w);
        clip_rect.y = fVar2;
      }
      ImFont::RenderText(pIStack_18,this,pos_local._4_4_,*pos,col,(ImVec4 *)local_54,text_begin,
                         stack0xffffffffffffffc0,clip_rect.z,cpu_fine_clip_rect != (ImVec4 *)0x0);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddText(const ImFont* font, float font_size, const ImVec2& pos, ImU32 col, const char* text_begin, const char* text_end, float wrap_width, const ImVec4* cpu_fine_clip_rect)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (text_end == NULL)
        text_end = text_begin + strlen(text_begin);
    if (text_begin == text_end)
        return;

    // Pull default font/size from the shared ImDrawListSharedData instance
    if (font == NULL)
        font = _Data->Font;
    if (font_size == 0.0f)
        font_size = _Data->FontSize;

    IM_ASSERT(font->ContainerAtlas->TexID == _CmdHeader.TextureId);  // Use high-level ImGui::PushFont() or low-level ImDrawList::PushTextureId() to change font.

    ImVec4 clip_rect = _CmdHeader.ClipRect;
    if (cpu_fine_clip_rect)
    {
        clip_rect.x = ImMax(clip_rect.x, cpu_fine_clip_rect->x);
        clip_rect.y = ImMax(clip_rect.y, cpu_fine_clip_rect->y);
        clip_rect.z = ImMin(clip_rect.z, cpu_fine_clip_rect->z);
        clip_rect.w = ImMin(clip_rect.w, cpu_fine_clip_rect->w);
    }
    font->RenderText(this, font_size, pos, col, clip_rect, text_begin, text_end, wrap_width, cpu_fine_clip_rect != NULL);
}